

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O3

void __thiscall
CPP::WriteInitialization::writeThemeIconCheckAssignment
          (WriteInitialization *this,QString *themeValue,QString *iconName,DomResourceIcon *i)

{
  QString *pQVar1;
  QString *indent;
  QArrayData *pQVar2;
  long lVar3;
  Language LVar4;
  QTextStream *pQVar5;
  char *pcVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  iconFromTheme local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  LVar4 = language::language();
  pQVar1 = &this->m_indent;
  pQVar5 = (QTextStream *)QTextStream::operator<<(this->m_output,pQVar1);
  QTextStream::operator<<(pQVar5,"if ");
  if (LVar4 == Cpp) {
    QTextStream::operator<<(this->m_output,'(');
    pcVar7 = ") {";
    pcVar6 = "} else {";
  }
  else {
    pcVar7 = ":";
    pcVar6 = "else:";
  }
  pQVar5 = (QTextStream *)QTextStream::operator<<(this->m_output,"QIcon");
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)&language::qualifier);
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,"hasThemeIcon(");
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,themeValue);
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,')');
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,pcVar7);
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,'\n');
  indent = &this->m_dindent;
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,indent);
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,iconName);
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5," = ");
  local_50.m_theme.d.d = (themeValue->d).d;
  local_50.m_theme.d.ptr = (themeValue->d).ptr;
  local_50.m_theme.d.size = (themeValue->d).size;
  if (&(local_50.m_theme.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_50.m_theme.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_50.m_theme.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  CPP::operator<<(pQVar5,&local_50);
  QTextStream::operator<<(pQVar5,(QString *)&language::eol);
  if (&(local_50.m_theme.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.m_theme.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.m_theme.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_50.m_theme.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_50.m_theme.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar5 = (QTextStream *)QTextStream::operator<<(this->m_output,pQVar1);
  pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,pcVar6);
  QTextStream::operator<<(pQVar5,'\n');
  pQVar2 = &((this->m_uic->pixFunction).d.d)->super_QArrayData;
  lVar3 = (this->m_uic->pixFunction).d.size;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if (lVar3 == 0) {
    writeResourceIcon(this->m_output,iconName,indent,i);
  }
  else {
    writePixmapFunctionIcon(this,this->m_output,iconName,indent,i);
  }
  if (LVar4 == Cpp) {
    pQVar5 = (QTextStream *)QTextStream::operator<<(this->m_output,pQVar1);
    QTextStream::operator<<(pQVar5,'}');
  }
  QTextStream::operator<<(this->m_output,'\n');
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::writeThemeIconCheckAssignment(const QString &themeValue,
                                                        const QString &iconName,
                                                        const DomResourceIcon *i)

{
    const bool isCpp = language::language() == Language::Cpp;
    m_output << m_indent << "if ";
    if (isCpp)
        m_output << '(';
    m_output << "QIcon" << language::qualifier << "hasThemeIcon("
             << themeValue << ')' << (isCpp ? ") {" : ":") << '\n'
             << m_dindent << iconName << " = " << iconFromTheme(themeValue)
             << language::eol;
    m_output << m_indent << (isCpp ? "} else {" : "else:") << '\n';
    if (m_uic->pixmapFunction().isEmpty())
        writeResourceIcon(m_output, iconName, m_dindent, i);
    else
        writePixmapFunctionIcon(m_output, iconName, m_dindent, i);
    if (isCpp)
        m_output << m_indent << '}';
    m_output  << '\n';
}